

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

int __thiscall
TPZSkylMatrix<double>::Resize(TPZSkylMatrix<double> *this,int64_t newDim,int64_t param_2)

{
  double **ppdVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int64_t iVar3;
  
  iVar2 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])();
  if (CONCAT44(extraout_var,iVar2) != newDim) {
    TPZVec<double_*>::Resize(&this->fElem,newDim + 1);
    iVar2 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [0xc])(this);
    iVar3 = newDim;
    if (CONCAT44(extraout_var_00,iVar2) <= newDim) {
      iVar2 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0xc])(this);
      iVar3 = CONCAT44(extraout_var_01,iVar2);
    }
    for (; ppdVar1 = (this->fElem).fStore, iVar3 < newDim; iVar3 = iVar3 + 1) {
      ppdVar1[iVar3 + 1] = ppdVar1[iVar3];
    }
    TPZVec<double>::Resize(&this->fStorage,(long)ppdVar1[newDim] - (long)*ppdVar1 >> 3);
    (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol = newDim;
    (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = newDim;
    (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\0';
  }
  return 1;
}

Assistant:

int TPZSkylMatrix<TVar>::Resize( int64_t newDim ,int64_t ) {
	if ( newDim == this->Dim() )
		return( 1 );
	
	fElem.Resize(newDim+1);
	// Cria nova matrix.
	
	// Copia os elementos para a nova matriz.
	int64_t min = MIN( newDim, this->Dim() );
	int64_t i;
	for ( i = min+1; i <= newDim; i++ )
		fElem[i] = fElem[i-1];
	
	// Zera as posicoes que sobrarem (se sobrarem)
	fStorage.Resize(fElem[newDim]-fElem[0]);
	this->fRow = this->fCol = newDim;
	this->fDecomposed = 0;
	return( 1 );
}